

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  fpclass_type fVar1;
  int32_t iVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  bool bVar5;
  type_conflict5 tVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  int *piVar18;
  int iVar19;
  byte bVar20;
  int local_4ac;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a8;
  int *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_490;
  int *local_488;
  int *local_480;
  int *local_478;
  pointer local_470;
  int *local_468;
  int *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  int *local_450;
  int *local_448;
  ulong local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  iVar19 = rhsn;
  bVar20 = 0;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 0x1c;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems[6] = 0;
  local_3b8.data._M_elems[7] = 0;
  local_3b8.data._M_elems[8] = 0;
  local_3b8.data._M_elems[9] = 0;
  local_3b8.data._M_elems[10] = 0;
  local_3b8.data._M_elems[0xb] = 0;
  local_3b8.data._M_elems[0xc] = 0;
  local_3b8.data._M_elems[0xd] = 0;
  local_3b8.data._M_elems[0xe] = 0;
  local_3b8.data._M_elems[0xf] = 0;
  local_3b8.data._M_elems[0x10] = 0;
  local_3b8.data._M_elems[0x11] = 0;
  local_3b8.data._M_elems[0x12] = 0;
  local_3b8.data._M_elems[0x13] = 0;
  local_3b8.data._M_elems[0x14] = 0;
  local_3b8.data._M_elems[0x15] = 0;
  local_3b8.data._M_elems[0x16] = 0;
  local_3b8.data._M_elems[0x17] = 0;
  local_3b8.data._M_elems[0x18] = 0;
  local_3b8.data._M_elems[0x19] = 0;
  local_3b8.data._M_elems._104_5_ = 0;
  local_3b8.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  local_460 = (this->row).orig;
  piVar18 = (this->col).orig;
  local_4a0 = (this->col).perm;
  local_4ac = 0;
  local_4a8 = this;
  local_498 = eps;
  local_490 = rhs;
  local_458 = vec;
  local_450 = vecidx;
  while (local_4ac < iVar19) {
    enQueueMin(rhsidx,&local_4ac,local_4a0[rhsidx[local_4ac]]);
  }
  local_470 = (local_4a8->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_478 = (local_4a8->u).row.idx;
  local_480 = (local_4a8->u).row.len;
  local_488 = (local_4a8->u).row.start;
  iVar8 = 0;
  local_468 = piVar18;
  while( true ) {
    lVar10 = 0x1c;
    if (iVar19 < 1) break;
    iVar7 = deQueueMin(rhsidx,&rhsn);
    iVar19 = piVar18[iVar7];
    pcVar13 = &local_490[iVar19].m_backend;
    pcVar15 = &local_330;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
    }
    local_330.exp = local_490[iVar19].m_backend.exp;
    local_330.neg = local_490[iVar19].m_backend.neg;
    local_330.fpclass = local_490[iVar19].m_backend.fpclass;
    local_330.prec_elem = local_490[iVar19].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&local_490[iVar19].m_backend,0);
    pcVar13 = &local_330;
    pnVar12 = &local_b0;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = local_330.exp;
    local_b0.m_backend.neg = local_330.neg;
    local_b0.m_backend.fpclass = local_330.fpclass;
    local_b0.m_backend.prec_elem = local_330.prec_elem;
    pnVar12 = local_498;
    pnVar14 = &local_130;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (local_498->m_backend).exp;
    local_130.m_backend.neg = (local_498->m_backend).neg;
    local_130.m_backend.fpclass = (local_498->m_backend).fpclass;
    local_130.m_backend.prec_elem = (local_498->m_backend).prec_elem;
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_b0,&local_130);
    iVar19 = rhsn;
    if (bVar5) {
      iVar19 = local_460[iVar7];
      local_450[iVar8] = iVar19;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_330,
                 &(local_4a8->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend);
      pcVar13 = &local_330;
      pnVar12 = local_458 + iVar19;
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_458[iVar19].m_backend.exp = local_330.exp;
      local_458[iVar19].m_backend.neg = local_330.neg;
      local_458[iVar19].m_backend.fpclass = local_330.fpclass;
      local_458[iVar19].m_backend.prec_elem = local_330.prec_elem;
      local_448 = local_478 + local_488[iVar19];
      pcVar13 = &local_470[local_488[iVar19]].m_backend;
      local_440 = (ulong)(uint)local_480[iVar19];
      lVar10 = 0;
      while( true ) {
        lVar9 = 0x1c;
        if ((int)local_440 == (int)lVar10) break;
        iVar19 = local_448[lVar10];
        pnVar12 = local_490 + iVar19;
        pnVar14 = pnVar12;
        pcVar15 = &local_3b8;
        for (lVar11 = lVar9; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
        }
        local_3b8.exp = local_490[iVar19].m_backend.exp;
        local_3b8.neg = local_490[iVar19].m_backend.neg;
        local_3b8.fpclass = local_490[iVar19].m_backend.fpclass;
        local_3b8.prec_elem = local_490[iVar19].m_backend.prec_elem;
        result_1.m_backend.data._M_elems._0_8_ =
             result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar6 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3b8,(int *)&result_1.m_backend);
        if (tVar6) {
          pcVar15 = &local_330;
          pnVar14 = &result;
          for (; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar15 + ((ulong)bVar20 * -2 + 1) * 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          result.m_backend.exp = local_330.exp;
          result.m_backend.neg = local_330.neg;
          result.m_backend.fpclass = local_330.fpclass;
          result.m_backend.prec_elem = local_330.prec_elem;
          if (local_330.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_330.neg ^ 1);
          }
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result.m_backend,pcVar13);
          lVar9 = 0x1c;
          pcVar15 = &result_1.m_backend;
          pcVar16 = &local_3b8;
          for (lVar11 = lVar9; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar16->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar16 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_3b8.exp = result_1.m_backend.exp;
          local_3b8.neg = result_1.m_backend.neg;
          fVar1 = result_1.m_backend.fpclass;
          iVar2 = result_1.m_backend.prec_elem;
          local_3b8.fpclass = result_1.m_backend.fpclass;
          local_3b8.prec_elem = result_1.m_backend.prec_elem;
          pcVar15 = &local_3b8;
          pnVar14 = &local_230;
          for (lVar11 = lVar9; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar15 + ((ulong)bVar20 * -2 + 1) * 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_230.m_backend.exp = result_1.m_backend.exp;
          local_230.m_backend.neg = result_1.m_backend.neg;
          local_230.m_backend.fpclass = fVar1;
          local_230.m_backend.prec_elem = iVar2;
          pnVar14 = local_498;
          pnVar17 = &local_1b0;
          for (lVar11 = lVar9; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = (local_498->m_backend).exp;
          local_1b0.m_backend.neg = (local_498->m_backend).neg;
          local_1b0.m_backend.fpclass = (local_498->m_backend).fpclass;
          local_1b0.m_backend.prec_elem = (local_498->m_backend).prec_elem;
          bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_230,&local_1b0);
          if (bVar5) {
            pcVar15 = &local_3b8;
            pnVar14 = pnVar12;
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar15 + ((ulong)bVar20 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
            }
            (pnVar12->m_backend).exp = local_3b8.exp;
            (pnVar12->m_backend).neg = local_3b8.neg;
            (pnVar12->m_backend).fpclass = local_3b8.fpclass;
            (pnVar12->m_backend).prec_elem = local_3b8.prec_elem;
            enQueueMin(rhsidx,&rhsn,local_4a0[iVar19]);
          }
        }
        else {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&local_330,pcVar13);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_3b8,&result_1.m_backend);
          result.m_backend.data._M_elems[0] = 0;
          tVar6 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3b8,(int *)&result);
          if (tVar6) {
            pcVar15 = &local_3b8;
            pcVar16 = &result_1.m_backend;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
            }
            pcVar15 = &local_3b8;
            pcVar16 = &local_3b8;
            pcVar3 = &local_3b8;
            pcVar4 = &local_3b8;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_1.m_backend,1e-100,(type *)0x0);
            pcVar15 = &result_1.m_backend;
            pcVar16 = &result_1.m_backend;
            pcVar3 = &result_1.m_backend;
            pcVar4 = &result_1.m_backend;
          }
          iVar19 = pcVar15->exp;
          bVar5 = pcVar16->neg;
          fVar1 = pcVar3->fpclass;
          iVar2 = pcVar4->prec_elem;
          pcVar15 = &result_1.m_backend;
          pnVar14 = pnVar12;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          (pnVar12->m_backend).exp = iVar19;
          (pnVar12->m_backend).neg = bVar5;
          (pnVar12->m_backend).fpclass = fVar1;
          (pnVar12->m_backend).prec_elem = iVar2;
        }
        pcVar13 = pcVar13 + 1;
        lVar10 = lVar10 + 1;
      }
      iVar8 = iVar8 + 1;
      piVar18 = local_468;
      iVar19 = rhsn;
    }
  }
  return iVar8;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}